

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O2

void __thiscall Fl_Tree::scrollbar_size(Fl_Tree *this,int size)

{
  Fl_Scrollbar *pFVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)size;
  this->_scrollbar_size = size;
  if (size == 0) {
    uVar2 = Fl::scrollbar_size();
    uVar3 = (ulong)uVar2;
  }
  pFVar1 = this->_vscroll;
  if ((pFVar1->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.w_ == (int)uVar3) {
    return;
  }
  (*(pFVar1->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget[4])
            (pFVar1,(ulong)(uint)(((this->super_Fl_Group).super_Fl_Widget.x_ - (int)uVar3) +
                                 (this->super_Fl_Group).super_Fl_Widget.w_),
             (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.h_,uVar3,
             (ulong)(uint)(pFVar1->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.h_);
  return;
}

Assistant:

void Fl_Tree::scrollbar_size(int size) {
  _scrollbar_size = size;
  int scrollsize = _scrollbar_size ? _scrollbar_size : Fl::scrollbar_size();
  if ( _vscroll->w() != scrollsize ) {
    _vscroll->resize(x()+w()-scrollsize, h(), scrollsize, _vscroll->h());
  }
#if FLTK_ABI_VERSION >= 10303
  if ( _hscroll->h() != scrollsize ) {
    _hscroll->resize(x(), y()+h()-scrollsize, _hscroll->w(), scrollsize);
  }
  // Changing scrollbar size affects _tiw/_tih + may affect scrollbar visibility
  calc_dimensions();
#endif
}